

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

int __thiscall
QtPrivate::QCalendarDateValidator::countRepeat(QCalendarDateValidator *this,QString *str,int index)

{
  char16_t *pcVar1;
  long lVar2;
  
  pcVar1 = (str->d).ptr + index;
  for (lVar2 = 1; (index + lVar2 < (str->d).size && (pcVar1[lVar2] == *pcVar1)); lVar2 = lVar2 + 1)
  {
  }
  return (int)lVar2;
}

Assistant:

int QCalendarDateValidator::countRepeat(const QString &str, int index) const
{
    Q_ASSERT(index >= 0 && index < str.size());
    int count = 1;
    const QChar ch = str.at(index);
    while (index + count < str.size() && str.at(index + count) == ch)
        ++count;
    return count;
}